

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_value.cpp
# Opt level: O3

void test_type_conversion(void)

{
  uint uVar1;
  bool bVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  int32_t iVar5;
  int iVar6;
  version vVar7;
  uint *puVar8;
  uint *puVar9;
  wostream *pwVar10;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar11;
  size_type __rlen;
  value _l;
  value _r;
  gc_heap h;
  undefined1 local_120 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_118;
  double local_f8;
  undefined1 local_f0 [40];
  string_view local_c8;
  gc_heap local_b8;
  string_view local_48;
  undefined8 local_38;
  
  mjs::gc_heap::gc_heap(&local_b8,0x200);
  mjs::to_primitive((value *)local_120,(value *)&mjs::value::undefined,undefined);
  mjs::value::value((value *)local_f0,(value *)&mjs::value::undefined);
  bVar2 = mjs::operator==((value *)local_120,(value *)local_f0);
  if (!bVar2) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x56);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_primitive(value::undefined)");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"value::undefined");
    pwVar10 = std::operator<<(pwVar10,"\n");
    mjs::debug_print(pwVar10,(value *)local_120,4,0x7fffffff,0);
    pwVar10 = std::operator<<(pwVar10," != ");
    mjs::debug_print(pwVar10,(value *)local_f0,4,0x7fffffff,0);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  mjs::value::destroy((value *)local_f0);
  mjs::value::destroy((value *)local_120);
  mjs::to_primitive((value *)local_120,(value *)&mjs::value::null,undefined);
  mjs::value::value((value *)local_f0,(value *)&mjs::value::null);
  bVar2 = mjs::operator==((value *)local_120,(value *)local_f0);
  if (!bVar2) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x57);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_primitive(value::null)");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"value::null");
    pwVar10 = std::operator<<(pwVar10,"\n");
    mjs::debug_print(pwVar10,(value *)local_120,4,0x7fffffff,0);
    pwVar10 = std::operator<<(pwVar10," != ");
    mjs::debug_print(pwVar10,(value *)local_f0,4,0x7fffffff,0);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  mjs::value::destroy((value *)local_f0);
  mjs::value::destroy((value *)local_120);
  local_f0._0_4_ = boolean;
  local_f0[8] = true;
  mjs::to_primitive((value *)local_120,(value *)local_f0,undefined);
  mjs::value::destroy((value *)local_f0);
  local_f0._0_4_ = boolean;
  local_f0[8] = 1;
  bVar2 = mjs::operator==((value *)local_120,(value *)local_f0);
  if (!bVar2) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x58);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_primitive(value{true})");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"value{true}");
    pwVar10 = std::operator<<(pwVar10,"\n");
    mjs::debug_print(pwVar10,(value *)local_120,4,0x7fffffff,0);
    pwVar10 = std::operator<<(pwVar10," != ");
    mjs::debug_print(pwVar10,(value *)local_f0,4,0x7fffffff,0);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  mjs::value::destroy((value *)local_f0);
  mjs::value::destroy((value *)local_120);
  local_f0._0_4_ = number;
  local_f0._8_8_ = (gc_heap *)0x4045000000000000;
  mjs::to_primitive((value *)local_120,(value *)local_f0,undefined);
  mjs::value::destroy((value *)local_f0);
  local_f0._0_4_ = number;
  local_f0._8_8_ = (gc_heap *)0x4045000000000000;
  bVar2 = mjs::operator==((value *)local_120,(value *)local_f0);
  if (!bVar2) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x59);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_primitive(value{42.0})");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"value{42.0}");
    pwVar10 = std::operator<<(pwVar10,"\n");
    mjs::debug_print(pwVar10,(value *)local_120,4,0x7fffffff,0);
    pwVar10 = std::operator<<(pwVar10," != ");
    mjs::debug_print(pwVar10,(value *)local_f0,4,0x7fffffff,0);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  mjs::value::destroy((value *)local_f0);
  mjs::value::destroy((value *)local_120);
  local_48._M_len = 4;
  local_48._M_str = "test";
  mjs::string::string((string *)&local_c8,&local_b8,&local_48);
  local_f0._0_4_ = string;
  local_f0._8_8_ = local_c8._M_len;
  local_f0._16_4_ = (uint32_t)local_c8._M_str;
  if ((gc_heap *)local_c8._M_len != (gc_heap *)0x0) {
    mjs::gc_heap::attach((gc_heap *)local_c8._M_len,(gc_heap_ptr_untyped *)(local_f0 + 8));
  }
  mjs::to_primitive((value *)local_120,(value *)local_f0,undefined);
  mjs::value::destroy((value *)local_f0);
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c8);
  local_48._M_len = 4;
  local_48._M_str = "test";
  mjs::string::string((string *)&local_c8,&local_b8,&local_48);
  local_f0._0_4_ = string;
  local_f0._8_8_ = local_c8._M_len;
  local_f0._16_4_ = (uint32_t)local_c8._M_str;
  if ((gc_heap *)local_c8._M_len != (gc_heap *)0x0) {
    mjs::gc_heap::attach((gc_heap *)local_c8._M_len,(gc_heap_ptr_untyped *)(local_f0 + 8));
  }
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c8);
  bVar2 = mjs::operator==((value *)local_120,(value *)local_f0);
  if (!bVar2) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x5a);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_primitive((value{string{h, \"test\"}}))");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"(value{string{h, \"test\"}})");
    pwVar10 = std::operator<<(pwVar10,"\n");
    mjs::debug_print(pwVar10,(value *)local_120,4,0x7fffffff,0);
    pwVar10 = std::operator<<(pwVar10," != ");
    mjs::debug_print(pwVar10,(value *)local_f0,4,0x7fffffff,0);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  mjs::value::destroy((value *)local_f0);
  mjs::value::destroy((value *)local_120);
  bVar2 = mjs::to_boolean((value *)&mjs::value::undefined);
  if (bVar2) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x5d);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"!!(!to_boolean(value::undefined))");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"true");
    pwVar10 = std::operator<<(pwVar10,"\n");
    pwVar10 = std::wostream::_M_insert<bool>(SUB81(pwVar10,0));
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::wostream::_M_insert<bool>(SUB81(pwVar10,0));
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  bVar2 = mjs::to_boolean((value *)&mjs::value::null);
  if (bVar2) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x5e);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"!!(!to_boolean(value::null))");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"true");
    pwVar10 = std::operator<<(pwVar10,"\n");
    pwVar10 = std::wostream::_M_insert<bool>(SUB81(pwVar10,0));
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::wostream::_M_insert<bool>(SUB81(pwVar10,0));
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  local_120._0_4_ = boolean;
  local_118.n_ = local_118.n_ & 0xffffffffffffff00;
  bVar2 = mjs::to_boolean((value *)local_120);
  mjs::value::destroy((value *)local_120);
  if (bVar2) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x5f);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"!!(!to_boolean(value{false}))");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"true");
    pwVar10 = std::operator<<(pwVar10,"\n");
    pwVar10 = std::wostream::_M_insert<bool>(SUB81(pwVar10,0));
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::wostream::_M_insert<bool>(SUB81(pwVar10,0));
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  local_120._0_4_ = boolean;
  local_118.b_ = (bool)1;
  bVar2 = mjs::to_boolean((value *)local_120);
  mjs::value::destroy((value *)local_120);
  if (!bVar2) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x60);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"!!(to_boolean(value{true}))");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"true");
    pwVar10 = std::operator<<(pwVar10,"\n");
    pwVar10 = std::wostream::_M_insert<bool>(SUB81(pwVar10,0));
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::wostream::_M_insert<bool>(SUB81(pwVar10,0));
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  local_120._0_4_ = number;
  local_118.n_ = NAN;
  bVar2 = mjs::to_boolean((value *)local_120);
  mjs::value::destroy((value *)local_120);
  if (bVar2) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x61);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"!!(!to_boolean(value{(__builtin_nanf (\"\"))}))");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"true");
    pwVar10 = std::operator<<(pwVar10,"\n");
    pwVar10 = std::wostream::_M_insert<bool>(SUB81(pwVar10,0));
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::wostream::_M_insert<bool>(SUB81(pwVar10,0));
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  local_120._0_4_ = number;
  local_118.n_ = 0.0;
  bVar2 = mjs::to_boolean((value *)local_120);
  mjs::value::destroy((value *)local_120);
  if (bVar2) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x62);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"!!(!to_boolean(value{0.0}))");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"true");
    pwVar10 = std::operator<<(pwVar10,"\n");
    pwVar10 = std::wostream::_M_insert<bool>(SUB81(pwVar10,0));
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::wostream::_M_insert<bool>(SUB81(pwVar10,0));
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  local_120._0_4_ = number;
  local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x4045000000000000;
  bVar2 = mjs::to_boolean((value *)local_120);
  mjs::value::destroy((value *)local_120);
  if (!bVar2) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,99);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"!!(to_boolean(value{42.0}))");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"true");
    pwVar10 = std::operator<<(pwVar10,"\n");
    pwVar10 = std::wostream::_M_insert<bool>(SUB81(pwVar10,0));
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::wostream::_M_insert<bool>(SUB81(pwVar10,0));
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  local_c8._M_len = 0;
  local_c8._M_str = "";
  mjs::string::string((string *)local_f0,&local_b8,&local_c8);
  local_120._0_4_ = string;
  local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)CONCAT44(local_f0._4_4_,local_f0._0_4_);
  local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
  if (local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ !=
      (gc_heap *)0x0) {
    mjs::gc_heap::attach
              (local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_,
               (gc_heap_ptr_untyped *)(local_120 + 8));
  }
  bVar2 = mjs::to_boolean((value *)local_120);
  mjs::value::destroy((value *)local_120);
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
  if (bVar2) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,100);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"!!(!to_boolean(value{string{h,\"\"}}))");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"true");
    pwVar10 = std::operator<<(pwVar10,"\n");
    pwVar10 = std::wostream::_M_insert<bool>(SUB81(pwVar10,0));
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::wostream::_M_insert<bool>(SUB81(pwVar10,0));
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  local_c8._M_len = 4;
  local_c8._M_str = "test";
  mjs::string::string((string *)local_f0,&local_b8,&local_c8);
  local_120._0_4_ = string;
  local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)CONCAT44(local_f0._4_4_,local_f0._0_4_);
  local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
  if (local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ !=
      (gc_heap *)0x0) {
    mjs::gc_heap::attach
              (local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_,
               (gc_heap_ptr_untyped *)(local_120 + 8));
  }
  bVar2 = mjs::to_boolean((value *)local_120);
  mjs::value::destroy((value *)local_120);
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
  if (!bVar2) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x65);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"!!(to_boolean(value{string{h,\"test\"}}))");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"true");
    pwVar10 = std::operator<<(pwVar10,"\n");
    pwVar10 = std::wostream::_M_insert<bool>(SUB81(pwVar10,0));
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::wostream::_M_insert<bool>(SUB81(pwVar10,0));
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  local_48._M_len = 6;
  local_48._M_str = "Object";
  mjs::string::string((string *)&local_c8,&local_b8,&local_48);
  local_38 = 0;
  mjs::gc_heap::allocate_and_construct<mjs::object,mjs::string,decltype(nullptr)>
            ((gc_heap *)local_f0,(size_t)&local_b8,(string *)0x20,(void **)&local_c8);
  local_120._0_4_ = object;
  local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)CONCAT44(local_f0._4_4_,local_f0._0_4_);
  local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
  if (local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ !=
      (gc_heap *)0x0) {
    mjs::gc_heap::attach
              (local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_,
               (gc_heap_ptr_untyped *)(local_120 + 8));
  }
  bVar2 = mjs::to_boolean((value *)local_120);
  mjs::value::destroy((value *)local_120);
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c8);
  if (!bVar2) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x66);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,
                              "!!(to_boolean(value{h.make<object>(string{h,\"Object\"}, nullptr)}))"
                             );
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"true");
    pwVar10 = std::operator<<(pwVar10,"\n");
    pwVar10 = std::wostream::_M_insert<bool>(SUB81(pwVar10,0));
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::wostream::_M_insert<bool>(SUB81(pwVar10,0));
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  local_118.n_ = mjs::to_number((value *)&mjs::value::undefined);
  local_120._0_4_ = number;
  local_f0._0_4_ = number;
  local_f0._8_8_ = (gc_heap *)0x7ff8000000000000;
  bVar2 = mjs::operator==((value *)local_120,(value *)local_f0);
  if (!bVar2) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x68);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"value{to_number(value::undefined)}");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"value{NAN}");
    pwVar10 = std::operator<<(pwVar10,"\n");
    mjs::debug_print(pwVar10,(value *)local_120,4,0x7fffffff,0);
    pwVar10 = std::operator<<(pwVar10," != ");
    mjs::debug_print(pwVar10,(value *)local_f0,4,0x7fffffff,0);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  mjs::value::destroy((value *)local_f0);
  mjs::value::destroy((value *)local_120);
  local_f8 = mjs::to_number((value *)&mjs::value::null);
  if ((local_f8 != 0.0) || (NAN(local_f8))) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x69);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_number(value::null)");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"0");
    std::operator<<(pwVar10,"\n");
    pwVar10 = std::wostream::_M_insert<double>(local_f8);
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  local_120._0_4_ = boolean;
  local_118.n_ = local_118.n_ & 0xffffffffffffff00;
  local_f8 = mjs::to_number((value *)local_120);
  mjs::value::destroy((value *)local_120);
  if ((local_f8 != 0.0) || (NAN(local_f8))) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x6a);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_number(value{false})");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"0");
    std::operator<<(pwVar10,"\n");
    pwVar10 = std::wostream::_M_insert<double>(local_f8);
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  local_120._0_4_ = boolean;
  local_118.b_ = (bool)1;
  local_f8 = mjs::to_number((value *)local_120);
  mjs::value::destroy((value *)local_120);
  if ((local_f8 != 1.0) || (NAN(local_f8))) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x6b);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_number(value{true})");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"1");
    std::operator<<(pwVar10,"\n");
    pwVar10 = std::wostream::_M_insert<double>(local_f8);
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,1);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  local_120._0_4_ = number;
  local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x4045000000000000;
  local_f8 = mjs::to_number((value *)local_120);
  mjs::value::destroy((value *)local_120);
  if ((local_f8 != 42.0) || (NAN(local_f8))) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x6c);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_number(value{42.0})");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"42.0");
    std::operator<<(pwVar10,"\n");
    pwVar10 = std::wostream::_M_insert<double>(local_f8);
    std::operator<<(pwVar10," != ");
    pwVar10 = std::wostream::_M_insert<double>(42.0);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  local_c8._M_len = 5;
  local_c8._M_str = "42.25";
  mjs::string::string((string *)local_f0,&local_b8,&local_c8);
  local_120._0_4_ = string;
  local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)CONCAT44(local_f0._4_4_,local_f0._0_4_);
  local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
  if (local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ !=
      (gc_heap *)0x0) {
    mjs::gc_heap::attach
              (local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_,
               (gc_heap_ptr_untyped *)(local_120 + 8));
  }
  local_f8 = mjs::to_number((value *)local_120);
  mjs::value::destroy((value *)local_120);
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
  if ((local_f8 != 42.25) || (NAN(local_f8))) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x6d);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_number(value{string{h,\"42.25\"}})");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"42.25");
    std::operator<<(pwVar10,"\n");
    pwVar10 = std::wostream::_M_insert<double>(local_f8);
    std::operator<<(pwVar10," != ");
    pwVar10 = std::wostream::_M_insert<double>(42.25);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  local_c8._M_len = 4;
  local_c8._M_str = "1e80";
  mjs::string::string((string *)local_f0,&local_b8,&local_c8);
  local_120._0_4_ = string;
  local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)CONCAT44(local_f0._4_4_,local_f0._0_4_);
  local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
  if (local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ !=
      (gc_heap *)0x0) {
    mjs::gc_heap::attach
              (local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_,
               (gc_heap_ptr_untyped *)(local_120 + 8));
  }
  local_f8 = mjs::to_number((value *)local_120);
  mjs::value::destroy((value *)local_120);
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
  if ((local_f8 != 1e+80) || (NAN(local_f8))) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x6e);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_number(value{string{h,\"1e80\"}})");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"1e80");
    std::operator<<(pwVar10,"\n");
    pwVar10 = std::wostream::_M_insert<double>(local_f8);
    std::operator<<(pwVar10," != ");
    pwVar10 = std::wostream::_M_insert<double>(1e+80);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  local_c8._M_len = 3;
  local_c8._M_str = "-60";
  mjs::string::string((string *)local_f0,&local_b8,&local_c8);
  local_120._0_4_ = string;
  local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)CONCAT44(local_f0._4_4_,local_f0._0_4_);
  local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_f0._8_4_;
  if (local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ !=
      (gc_heap *)0x0) {
    mjs::gc_heap::attach
              (local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_,
               (gc_heap_ptr_untyped *)(local_120 + 8));
  }
  local_f8 = mjs::to_number((value *)local_120);
  mjs::value::destroy((value *)local_120);
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
  if ((local_f8 != -60.0) || (NAN(local_f8))) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x6f);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_number(value{string{h,\"-60\"}})");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"-60");
    std::operator<<(pwVar10,"\n");
    pwVar10 = std::wostream::_M_insert<double>(local_f8);
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,-0x3c);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  local_120._0_4_ = number;
  local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0xc045200000000000;
  local_f8 = mjs::to_integer((value *)local_120);
  mjs::value::destroy((value *)local_120);
  if ((local_f8 != -42.0) || (NAN(local_f8))) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x73);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_integer(value{-42.25})");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"-42");
    std::operator<<(pwVar10,"\n");
    pwVar10 = std::wostream::_M_insert<double>(local_f8);
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,-0x2a);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  local_120._0_4_ = number;
  local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x41f0000000000000;
  local_f8 = mjs::to_integer((value *)local_120);
  mjs::value::destroy((value *)local_120);
  if ((local_f8 != 4294967296.0) || (NAN(local_f8))) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x74);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_integer(value{1.0*(1ULL<<32)})");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"(1ULL<<32)");
    std::operator<<(pwVar10,"\n");
    pwVar10 = std::wostream::_M_insert<double>(local_f8);
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::wostream::_M_insert<unsigned_long_long>((ulonglong)pwVar10);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  uVar4 = mjs::to_uint32(8589934591.0);
  if (uVar4 != 0xffffffff) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x76);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_uint32(0x1\'ffff\'ffff)");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"0xffff\'ffff");
    pwVar10 = std::operator<<(pwVar10,"\n");
    pwVar10 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar10);
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar10);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  iVar5 = mjs::to_int32(8589934591.0);
  if (iVar5 != -1) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x77);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_int32(0x1\'ffff\'ffff)");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"-1");
    pwVar10 = std::operator<<(pwVar10,"\n");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,iVar5);
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,-1);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  uVar3 = mjs::to_uint16(8589934591.0);
  if (uVar3 != 0xffff) {
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x78);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_uint16(0x1\'ffff\'ffff)");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"0xffff");
    pwVar10 = std::operator<<(pwVar10,"\n");
    pwVar10 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar10);
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0xffff);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  mjs::to_string((mjs *)local_120,&local_b8,(value *)&mjs::value::undefined);
  local_c8._M_len = 9;
  local_c8._M_str = "undefined";
  mjs::string::string((string *)local_f0,&local_b8,&local_c8);
  puVar8 = (uint *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_120);
  uVar1 = *puVar8;
  puVar9 = (uint *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f0);
  if (uVar1 != *puVar9) {
LAB_00115337:
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x7a);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_string(h, value::undefined)");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"(string{h, \"undefined\"})");
    pwVar10 = std::operator<<(pwVar10,"\n");
    pwVar10 = mjs::operator<<(pwVar10,(string *)local_120);
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = mjs::operator<<(pwVar10,(string *)local_f0);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  if ((ulong)uVar1 != 0) {
    iVar6 = wmemcmp((wchar_t *)(puVar8 + 1),(wchar_t *)(puVar9 + 1),(ulong)uVar1);
    if (iVar6 != 0) goto LAB_00115337;
  }
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
  mjs::to_string((mjs *)local_120,&local_b8,(value *)&mjs::value::null);
  local_c8._M_len = 4;
  local_c8._M_str = "null";
  mjs::string::string((string *)local_f0,&local_b8,&local_c8);
  puVar8 = (uint *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_120);
  uVar1 = *puVar8;
  puVar9 = (uint *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f0);
  if (uVar1 != *puVar9) {
LAB_0011542d:
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x7b);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_string(h, value::null)");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"(string{h, \"null\"})");
    pwVar10 = std::operator<<(pwVar10,"\n");
    pwVar10 = mjs::operator<<(pwVar10,(string *)local_120);
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = mjs::operator<<(pwVar10,(string *)local_f0);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  if ((ulong)uVar1 != 0) {
    iVar6 = wmemcmp((wchar_t *)(puVar8 + 1),(wchar_t *)(puVar9 + 1),(ulong)uVar1);
    if (iVar6 != 0) goto LAB_0011542d;
  }
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
  local_120._0_4_ = boolean;
  local_118.n_ = local_118.n_ & 0xffffffffffffff00;
  mjs::to_string((mjs *)local_f0,&local_b8,(value *)local_120);
  mjs::value::destroy((value *)local_120);
  local_c8._M_len = 5;
  local_c8._M_str = "false";
  mjs::string::string((string *)local_120,&local_b8,&local_c8);
  puVar8 = (uint *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f0);
  uVar1 = *puVar8;
  puVar9 = (uint *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_120);
  if (uVar1 != *puVar9) {
LAB_00115523:
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x7c);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_string(h, value{false})");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"(string{h, \"false\"})");
    pwVar10 = std::operator<<(pwVar10,"\n");
    pwVar10 = mjs::operator<<(pwVar10,(string *)local_f0);
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = mjs::operator<<(pwVar10,(string *)local_120);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  if ((ulong)uVar1 != 0) {
    iVar6 = wmemcmp((wchar_t *)(puVar8 + 1),(wchar_t *)(puVar9 + 1),(ulong)uVar1);
    if (iVar6 != 0) goto LAB_00115523;
  }
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
  local_120._0_4_ = boolean;
  local_118.b_ = (bool)1;
  mjs::to_string((mjs *)local_f0,&local_b8,(value *)local_120);
  mjs::value::destroy((value *)local_120);
  local_c8._M_len = 4;
  local_c8._M_str = "true";
  mjs::string::string((string *)local_120,&local_b8,&local_c8);
  puVar8 = (uint *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f0);
  uVar1 = *puVar8;
  puVar9 = (uint *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_120);
  if (uVar1 != *puVar9) {
LAB_00115619:
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x7d);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_string(h, value{true})");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"(string{h, \"true\"})");
    pwVar10 = std::operator<<(pwVar10,"\n");
    pwVar10 = mjs::operator<<(pwVar10,(string *)local_f0);
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = mjs::operator<<(pwVar10,(string *)local_120);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  if ((ulong)uVar1 != 0) {
    iVar6 = wmemcmp((wchar_t *)(puVar8 + 1),(wchar_t *)(puVar9 + 1),(ulong)uVar1);
    if (iVar6 != 0) goto LAB_00115619;
  }
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
  local_120._0_4_ = number;
  local_118.n_ = NAN;
  mjs::to_string((mjs *)local_f0,&local_b8,(value *)local_120);
  mjs::value::destroy((value *)local_120);
  local_c8._M_len = 3;
  local_c8._M_str = "NaN";
  mjs::string::string((string *)local_120,&local_b8,&local_c8);
  puVar8 = (uint *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f0);
  uVar1 = *puVar8;
  puVar9 = (uint *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_120);
  if (uVar1 != *puVar9) {
LAB_0011570f:
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x7e);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_string(h, value{NAN})");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"(string{h, \"NaN\"})");
    pwVar10 = std::operator<<(pwVar10,"\n");
    pwVar10 = mjs::operator<<(pwVar10,(string *)local_f0);
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = mjs::operator<<(pwVar10,(string *)local_120);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  if ((ulong)uVar1 != 0) {
    iVar6 = wmemcmp((wchar_t *)(puVar8 + 1),(wchar_t *)(puVar9 + 1),(ulong)uVar1);
    if (iVar6 != 0) goto LAB_0011570f;
  }
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
  local_120._0_4_ = number;
  local_118.n_ = -0.0;
  mjs::to_string((mjs *)local_f0,&local_b8,(value *)local_120);
  mjs::value::destroy((value *)local_120);
  local_c8._M_len = 1;
  local_c8._M_str = "0";
  mjs::string::string((string *)local_120,&local_b8,&local_c8);
  puVar8 = (uint *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f0);
  uVar1 = *puVar8;
  puVar9 = (uint *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_120);
  if (uVar1 != *puVar9) {
LAB_00115805:
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x7f);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_string(h, value{-0.0})");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"(string{h, \"0\"})");
    pwVar10 = std::operator<<(pwVar10,"\n");
    pwVar10 = mjs::operator<<(pwVar10,(string *)local_f0);
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = mjs::operator<<(pwVar10,(string *)local_120);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  if ((ulong)uVar1 != 0) {
    iVar6 = wmemcmp((wchar_t *)(puVar8 + 1),(wchar_t *)(puVar9 + 1),(ulong)uVar1);
    if (iVar6 != 0) goto LAB_00115805;
  }
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
  local_120._0_4_ = number;
  local_118.n_ = INFINITY;
  mjs::to_string((mjs *)local_f0,&local_b8,(value *)local_120);
  mjs::value::destroy((value *)local_120);
  local_c8._M_len = 8;
  local_c8._M_str = "Infinity";
  mjs::string::string((string *)local_120,&local_b8,&local_c8);
  puVar8 = (uint *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f0);
  uVar1 = *puVar8;
  puVar9 = (uint *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_120);
  if (uVar1 != *puVar9) {
LAB_001158fb:
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x80);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_string(h, value{+INFINITY})");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"(string{h, \"Infinity\"})");
    pwVar10 = std::operator<<(pwVar10,"\n");
    pwVar10 = mjs::operator<<(pwVar10,(string *)local_f0);
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = mjs::operator<<(pwVar10,(string *)local_120);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  if ((ulong)uVar1 != 0) {
    iVar6 = wmemcmp((wchar_t *)(puVar8 + 1),(wchar_t *)(puVar9 + 1),(ulong)uVar1);
    if (iVar6 != 0) goto LAB_001158fb;
  }
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
  local_120._0_4_ = number;
  local_118.n_ = -INFINITY;
  mjs::to_string((mjs *)local_f0,&local_b8,(value *)local_120);
  mjs::value::destroy((value *)local_120);
  local_c8._M_len = 9;
  local_c8._M_str = "-Infinity";
  mjs::string::string((string *)local_120,&local_b8,&local_c8);
  puVar8 = (uint *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f0);
  uVar1 = *puVar8;
  puVar9 = (uint *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_120);
  if (uVar1 != *puVar9) {
LAB_001159f1:
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x81);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_string(h, value{-INFINITY})");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"(string{h, \"-Infinity\"})");
    pwVar10 = std::operator<<(pwVar10,"\n");
    pwVar10 = mjs::operator<<(pwVar10,(string *)local_f0);
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = mjs::operator<<(pwVar10,(string *)local_120);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  if ((ulong)uVar1 != 0) {
    iVar6 = wmemcmp((wchar_t *)(puVar8 + 1),(wchar_t *)(puVar9 + 1),(ulong)uVar1);
    if (iVar6 != 0) goto LAB_001159f1;
  }
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
  local_120._0_4_ = number;
  local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x4045200000000000;
  mjs::to_string((mjs *)local_f0,&local_b8,(value *)local_120);
  mjs::value::destroy((value *)local_120);
  local_c8._M_len = 5;
  local_c8._M_str = "42.25";
  mjs::string::string((string *)local_120,&local_b8,&local_c8);
  puVar8 = (uint *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f0);
  uVar1 = *puVar8;
  puVar9 = (uint *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_120);
  if (uVar1 != *puVar9) {
LAB_00115ae7:
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x82);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_string(h, value{42.25})");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"(string{h, \"42.25\"})");
    pwVar10 = std::operator<<(pwVar10,"\n");
    pwVar10 = mjs::operator<<(pwVar10,(string *)local_f0);
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = mjs::operator<<(pwVar10,(string *)local_120);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
    goto LAB_0011796f;
  }
  if ((ulong)uVar1 != 0) {
    iVar6 = wmemcmp((wchar_t *)(puVar8 + 1),(wchar_t *)(puVar9 + 1),(ulong)uVar1);
    if (iVar6 != 0) goto LAB_00115ae7;
  }
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
  local_48._M_len = 0;
  local_48._M_str = "";
  mjs::string::string((string *)&local_c8,&local_b8,&local_48);
  local_120._0_4_ = string;
  local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)local_c8._M_len;
  local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
       (uint32_t)local_c8._M_str;
  if ((gc_heap *)local_c8._M_len != (gc_heap *)0x0) {
    mjs::gc_heap::attach((gc_heap *)local_c8._M_len,(gc_heap_ptr_untyped *)(local_120 + 8));
  }
  mjs::to_string((mjs *)local_f0,&local_b8,(value *)local_120);
  mjs::value::destroy((value *)local_120);
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c8);
  local_c8._M_len = 0;
  local_c8._M_str = "";
  mjs::string::string((string *)local_120,&local_b8,&local_c8);
  puVar8 = (uint *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f0);
  uVar1 = *puVar8;
  puVar9 = (uint *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_120);
  if (uVar1 == *puVar9) {
    if ((ulong)uVar1 != 0) {
      iVar6 = wmemcmp((wchar_t *)(puVar8 + 1),(wchar_t *)(puVar9 + 1),(ulong)uVar1);
      if (iVar6 != 0) goto LAB_00115bdd;
    }
    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    local_48._M_len = 4;
    local_48._M_str = "test";
    mjs::string::string((string *)&local_c8,&local_b8,&local_48);
    local_120._0_4_ = string;
    local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)local_c8._M_len;
    local_118.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
         (uint32_t)local_c8._M_str;
    if ((gc_heap *)local_c8._M_len != (gc_heap *)0x0) {
      mjs::gc_heap::attach((gc_heap *)local_c8._M_len,(gc_heap_ptr_untyped *)(local_120 + 8));
    }
    mjs::to_string((mjs *)local_f0,&local_b8,(value *)local_120);
    mjs::value::destroy((value *)local_120);
    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c8);
    local_c8._M_len = 4;
    local_c8._M_str = "test";
    mjs::string::string((string *)local_120,&local_b8,&local_c8);
    puVar8 = (uint *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_f0);
    uVar1 = *puVar8;
    puVar9 = (uint *)mjs::gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_120);
    if (uVar1 == *puVar9) {
      if ((ulong)uVar1 == 0) {
LAB_001152d3:
        mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
        mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
        mjs::gc_heap::garbage_collect(&local_b8);
        if ((int)(((ulong)(local_b8.alloc_context_.next_free_ - local_b8.alloc_context_.start_) *
                  100) / (ulong)(local_b8.alloc_context_.capacity_ - local_b8.alloc_context_.start_)
                 ) == 0) {
          mjs::gc_heap::~gc_heap(&local_b8);
          return;
        }
        __assert_fail("h.use_percentage() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                      ,0x88,"void test_type_conversion()");
      }
      iVar6 = wmemcmp((wchar_t *)(puVar8 + 1),(wchar_t *)(puVar9 + 1),(ulong)uVar1);
      if (iVar6 == 0) goto LAB_001152d3;
    }
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x84);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_string(h, value{string{h, \"test\"}})");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"(string{h, \"test\"})");
    pwVar10 = std::operator<<(pwVar10,"\n");
    pwVar10 = mjs::operator<<(pwVar10,(string *)local_f0);
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = mjs::operator<<(pwVar10,(string *)local_120);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
  }
  else {
LAB_00115bdd:
    pwVar10 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar10 = std::operator<<(pwVar10," in ");
    pwVar10 = std::operator<<(pwVar10,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                             );
    pwVar10 = std::operator<<(pwVar10,":");
    pwVar10 = (wostream *)std::wostream::operator<<((wostream *)pwVar10,0x83);
    pwVar10 = std::operator<<(pwVar10,":\n");
    pwVar10 = std::operator<<(pwVar10,"to_string(h, value{string{h, \"\"}})");
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = std::operator<<(pwVar10,"(string{h, \"\"})");
    pwVar10 = std::operator<<(pwVar10,"\n");
    pwVar10 = mjs::operator<<(pwVar10,(string *)local_f0);
    pwVar10 = std::operator<<(pwVar10," != ");
    pwVar10 = mjs::operator<<(pwVar10,(string *)local_120);
    pwVar10 = std::operator<<(pwVar10,"\n");
    vVar7 = tested_version();
    pbVar11 = mjs::operator<<(pwVar10,vVar7);
    std::operator<<(pbVar11,"\n");
  }
LAB_0011796f:
  abort();
}

Assistant:

void test_type_conversion() {
    gc_heap h{1<<9};
    // TODO: to_primitive hint
    REQUIRE_EQ(to_primitive(value::undefined), value::undefined);
    REQUIRE_EQ(to_primitive(value::null), value::null);
    REQUIRE_EQ(to_primitive(value{true}), value{true});
    REQUIRE_EQ(to_primitive(value{42.0}), value{42.0});
    REQUIRE_EQ(to_primitive((value{string{h, "test"}})), (value{string{h, "test"}}));
    // TODO: Object

    REQUIRE(!to_boolean(value::undefined));
    REQUIRE(!to_boolean(value::null));
    REQUIRE(!to_boolean(value{false}));
    REQUIRE(to_boolean(value{true}));
    REQUIRE(!to_boolean(value{NAN}));
    REQUIRE(!to_boolean(value{0.0}));
    REQUIRE(to_boolean(value{42.0}));
    REQUIRE(!to_boolean(value{string{h,""}}));
    REQUIRE(to_boolean(value{string{h,"test"}}));
    REQUIRE(to_boolean(value{h.make<object>(string{h,"Object"}, nullptr)}));

    REQUIRE_EQ(value{to_number(value::undefined)}, value{NAN});
    REQUIRE_EQ(to_number(value::null), 0);
    REQUIRE_EQ(to_number(value{false}), 0);
    REQUIRE_EQ(to_number(value{true}), 1);
    REQUIRE_EQ(to_number(value{42.0}), 42.0);
    REQUIRE_EQ(to_number(value{string{h,"42.25"}}), 42.25);
    REQUIRE_EQ(to_number(value{string{h,"1e80"}}), 1e80);
    REQUIRE_EQ(to_number(value{string{h,"-60"}}), -60);
    // TODO: Object


    REQUIRE_EQ(to_integer(value{-42.25}), -42);
    REQUIRE_EQ(to_integer(value{1.0*(1ULL<<32)}), (1ULL<<32));

    REQUIRE_EQ(to_uint32(0x1'ffff'ffff), 0xffff'ffff);
    REQUIRE_EQ(to_int32(0x1'ffff'ffff), -1);
    REQUIRE_EQ(to_uint16(0x1'ffff'ffff), 0xffff);

    REQUIRE_EQ(to_string(h, value::undefined), (string{h, "undefined"}));
    REQUIRE_EQ(to_string(h, value::null), (string{h, "null"}));
    REQUIRE_EQ(to_string(h, value{false}), (string{h, "false"}));
    REQUIRE_EQ(to_string(h, value{true}), (string{h, "true"}));
    REQUIRE_EQ(to_string(h, value{NAN}), (string{h, "NaN"}));
    REQUIRE_EQ(to_string(h, value{-0.0}), (string{h, "0"}));
    REQUIRE_EQ(to_string(h, value{+INFINITY}), (string{h, "Infinity"}));
    REQUIRE_EQ(to_string(h, value{-INFINITY}), (string{h, "-Infinity"}));
    REQUIRE_EQ(to_string(h, value{42.25}), (string{h, "42.25"}));
    REQUIRE_EQ(to_string(h, value{string{h, ""}}), (string{h, ""}));
    REQUIRE_EQ(to_string(h, value{string{h, "test"}}), (string{h, "test"}));
    // TODO: Object

    h.garbage_collect();
    assert(h.use_percentage() == 0);
}